

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O2

void __thiscall
SplitStringTest_random_long_prefix_delim_Test<char32_t>::
SplitStringTest_random_long_prefix_delim_Test
          (SplitStringTest_random_long_prefix_delim_Test<char32_t> *this)

{
  SplitStringTest<char32_t>::SplitStringTest(&this->super_SplitStringTest<char32_t>);
  *(undefined ***)&this->super_SplitStringTest<char32_t> = &PTR__Test_004b1308;
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_long_prefix_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomTestData<TypeParam> data{ delim };
	data.m_str = delim + data.m_str;
	data.m_tokens.emplace(data.m_tokens.begin());
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}